

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O0

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::CreateBacking
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint index)

{
  JitArenaAllocator *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  uint *puVar4;
  uint local_58;
  uint i;
  uint baseForSegment;
  TrackAllocData local_40;
  uint local_14;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *pSStack_10;
  uint index_local;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this_local;
  
  local_14 = index;
  pSStack_10 = this;
  if ((index < this->maxIndex) && (this->backingStore[index >> 4] != (uint *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
                       ,0xc4,"(index >= maxIndex || backingStore[index / numPerSegment] == nullptr)"
                       ,"index >= maxIndex || backingStore[index / numPerSegment] == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  EnsureBaseSize(this,local_14);
  if (this->backingStore[local_14 >> 4] == (uint *)0x0) {
    this_00 = this->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&unsigned_int::typeinfo,0,0x10,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
               ,0xca);
    this_01 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             this_00,&local_40);
    puVar4 = Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int,false>
                       ((Memory *)this_01,(JitArenaAllocator *)Memory::JitArenaAllocator::AllocLeaf,
                        0,0x10);
    this->backingStore[local_14 >> 4] = puVar4;
    for (local_58 = 0; local_58 < 0x10; local_58 = local_58 + 1) {
      this->backingStore[local_14 >> 4][local_58] = local_58 + (local_14 & 0xfffffff0);
    }
  }
  return;
}

Assistant:

inline void CreateBacking(indexType index)
    {
        Assert(index >= maxIndex || backingStore[index / numPerSegment] == nullptr);
        // grow the size of the pointer array if needed
        EnsureBaseSize(index);
        if (backingStore[index / numPerSegment] == nullptr)
        {
            // allocate a new segment
            backingStore[index / numPerSegment] = AllocatorNewArrayLeaf(TAllocator, alloc, indexType, numPerSegment);
            indexType baseForSegment = (index / numPerSegment) * numPerSegment;
            for (indexType i = 0; i < numPerSegment; i++)
            {
                backingStore[index / numPerSegment][i] = i + baseForSegment;
            }
        }
    }